

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_disks.cpp
# Opt level: O0

int benchmark_disks(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  Logger *pLVar3;
  Logger local_550;
  LoggerVoidify local_3d1;
  undefined4 local_3d0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  string allocstr;
  allocator local_f1;
  undefined1 local_f0 [8];
  string optrw;
  external_size_type block_size;
  external_size_type eStack_c0;
  uint batch_size;
  external_size_type offset;
  external_size_type size;
  CmdlineParser cp;
  char **argv_local;
  int argc_local;
  
  cp._144_8_ = argv;
  tlx::CmdlineParser::CmdlineParser((CmdlineParser *)&size);
  offset = 0;
  eStack_c0 = 0;
  block_size._4_4_ = 0;
  optrw.field_2._8_8_ = 0x800000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_f0,"rw",&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::string((string *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"quiet",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"quiet processing",&local_171);
  tlx::CmdlineParser::add_flag((CmdlineParser *)&size,'q',&local_148,&g_quiet,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"size",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"Amount of data to write/read from disks (e.g. 10GiB)",&local_1c1)
  ;
  tlx::CmdlineParser::add_param_bytes((CmdlineParser *)&size,&local_198,&offset,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"r|w",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"Only read or write blocks (default: both write and read)",
             &local_211);
  tlx::CmdlineParser::add_opt_param_string
            ((CmdlineParser *)&size,&local_1e8,(string *)local_f0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"alloc",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_260,
             "Block allocation strategy: random_cyclic, simple_random, fully_random, striping. (default: random_cyclic)"
             ,&local_261);
  tlx::CmdlineParser::add_opt_param_string
            ((CmdlineParser *)&size,&local_238,(string *)local_128,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"batch",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b0,"Number of blocks written/read in one batch (default: D * B)",
             &local_2b1);
  tlx::CmdlineParser::add_unsigned
            ((CmdlineParser *)&size,'b',&local_288,(uint *)((long)&block_size + 4),&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"block_size",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_300,"Size of blocks written in one syscall. (default: B = 8MiB)",
             &local_301);
  tlx::CmdlineParser::add_bytes
            ((CmdlineParser *)&size,'B',&local_2d8,(uint64_t *)(optrw.field_2._M_local_buf + 8),
             &local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"offset",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_350,"Starting offset of operation range. (default: 0)",&local_351);
  tlx::CmdlineParser::add_bytes
            ((CmdlineParser *)&size,'o',&local_328,&stack0xffffffffffffff40,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"time-limit",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"limit time of experiment (seconds)",&local_3a1)
  ;
  tlx::CmdlineParser::add_double((CmdlineParser *)&size,'T',&local_378,&g_time_limit,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c8,
             "This program will benchmark the disks configured by the standard .foxxll disk configuration files mechanism. Blocks of 8 MiB are written and/or read in sequence using the block manager. The batch size describes how many blocks are written/read in one batch. The are taken from block_manager using given the specified allocation strategy. If size == 0, then writing/reading operation are done until an error occurs. "
             ,&local_3c9);
  tlx::CmdlineParser::set_description((CmdlineParser *)&size,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  bVar1 = tlx::CmdlineParser::process((CmdlineParser *)&size,argc,(char **)cp._144_8_);
  if (bVar1) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      argv_local._4_4_ =
           benchmark_disks_alloc<foxxll::random_cyclic>
                     (offset,eStack_c0,(ulong)block_size._4_4_,optrw.field_2._8_8_,
                      (string *)local_f0);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_128,"random_cyclic");
      if (bVar1) {
        argv_local._4_4_ =
             benchmark_disks_alloc<foxxll::random_cyclic>
                       (offset,eStack_c0,(ulong)block_size._4_4_,optrw.field_2._8_8_,
                        (string *)local_f0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_128,"simple_random");
        if (bVar1) {
          argv_local._4_4_ =
               benchmark_disks_alloc<foxxll::simple_random>
                         (offset,eStack_c0,(ulong)block_size._4_4_,optrw.field_2._8_8_,
                          (string *)local_f0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_128,"fully_random");
          if (bVar1) {
            argv_local._4_4_ =
                 benchmark_disks_alloc<foxxll::fully_random>
                           (offset,eStack_c0,(ulong)block_size._4_4_,optrw.field_2._8_8_,
                            (string *)local_f0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_128,"striping");
            if (bVar1) {
              argv_local._4_4_ =
                   benchmark_disks_alloc<foxxll::striping>
                             (offset,eStack_c0,(ulong)block_size._4_4_,optrw.field_2._8_8_,
                              (string *)local_f0);
            }
            else {
              tlx::Logger::Logger(&local_550);
              pLVar3 = tlx::Logger::operator<<
                                 (&local_550,(char (*) [30])"Unknown allocation strategy \'");
              pLVar3 = tlx::Logger::operator<<
                                 (pLVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_128);
              pLVar3 = tlx::Logger::operator<<(pLVar3,(char (*) [2])0x1bf376);
              tlx::LoggerVoidify::operator&(&local_3d1,pLVar3);
              tlx::Logger::~Logger(&local_550);
              tlx::CmdlineParser::print_usage((CmdlineParser *)&size);
              argv_local._4_4_ = -1;
            }
          }
        }
      }
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  local_3d0 = 1;
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_f0);
  tlx::CmdlineParser::~CmdlineParser((CmdlineParser *)&size);
  return argv_local._4_4_;
}

Assistant:

int benchmark_disks(int argc, char* argv[])
{
    // parse command line

    tlx::CmdlineParser cp;

    external_size_type size = 0, offset = 0;
    unsigned int batch_size = 0;
    external_size_type block_size = 8 * MiB;
    std::string optrw = "rw", allocstr;

    cp.add_flag(
        'q', "quiet", g_quiet, "quiet processing"
    );

    cp.add_param_bytes(
        "size", size,
        "Amount of data to write/read from disks (e.g. 10GiB)"
    );
    cp.add_opt_param_string(
        "r|w", optrw,
        "Only read or write blocks (default: both write and read)"
    );
    cp.add_opt_param_string(
        "alloc", allocstr,
        "Block allocation strategy: random_cyclic, simple_random, fully_random, striping. (default: random_cyclic)"
    );

    cp.add_unsigned(
        'b', "batch", batch_size,
        "Number of blocks written/read in one batch (default: D * B)"
    );
    cp.add_bytes(
        'B', "block_size", block_size,
        "Size of blocks written in one syscall. (default: B = 8MiB)"
    );
    cp.add_bytes(
        'o', "offset", offset,
        "Starting offset of operation range. (default: 0)"
    );
    cp.add_double(
        'T', "time-limit", g_time_limit,
        "limit time of experiment (seconds)"
    );

    cp.set_description(
        "This program will benchmark the disks configured by the standard "
        ".foxxll disk configuration files mechanism. Blocks of 8 MiB are "
        "written and/or read in sequence using the block manager. The batch "
        "size describes how many blocks are written/read in one batch. The "
        "are taken from block_manager using given the specified allocation "
        "strategy. If size == 0, then writing/reading operation are done "
        "until an error occurs. "
    );

    if (!cp.process(argc, argv))
        return -1;

    if (allocstr.size())
    {
        if (allocstr == "random_cyclic")
            return benchmark_disks_alloc<foxxll::random_cyclic>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "simple_random")
            return benchmark_disks_alloc<foxxll::simple_random>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "fully_random")
            return benchmark_disks_alloc<foxxll::fully_random>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "striping")
            return benchmark_disks_alloc<foxxll::striping>(
                size, offset, batch_size, block_size, optrw
            );

        LOG1 << "Unknown allocation strategy '" << allocstr << "'";
        cp.print_usage();
        return -1;
    }

    return benchmark_disks_alloc<foxxll::default_alloc_strategy>(
        size, offset, batch_size, block_size, optrw
    );
}